

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

ZCC_Expression * __thiscall
ZCCCompiler::SimplifyFunctionCall(ZCCCompiler *this,ZCC_ExprFuncCall *callop)

{
  PType *target;
  uint uVar1;
  ZCC_Expression *pZVar2;
  int iVar3;
  ZCC_ExprConstant *pZVar4;
  ulong uVar5;
  bool bVar6;
  Conversion *route [8];
  Conversion *local_78 [9];
  
  pZVar2 = Simplify(this,callop->Function);
  callop->Function = pZVar2;
  pZVar4 = (ZCC_ExprConstant *)callop->Parameters;
  if (pZVar4 == (ZCC_ExprConstant *)0x0) {
    bVar6 = false;
    pZVar4 = (ZCC_ExprConstant *)0x0;
  }
  else {
    iVar3 = 1;
    do {
      if ((pZVar4->super_ZCC_Expression).super_ZCC_TreeNode.NodeType != AST_FuncParm) {
        __assert_fail("parm->NodeType == AST_FuncParm",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x16f,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      pZVar2 = Simplify(this,*(ZCC_Expression **)&(pZVar4->super_ZCC_Expression).Operation);
      *(ZCC_Expression **)&(pZVar4->super_ZCC_Expression).Operation = pZVar2;
      pZVar4 = (ZCC_ExprConstant *)(pZVar4->super_ZCC_Expression).super_ZCC_TreeNode.SiblingNext;
      iVar3 = iVar3 + -1;
    } while (pZVar4 != (ZCC_ExprConstant *)callop->Parameters);
    bVar6 = iVar3 == 0;
  }
  if (callop->Function->Operation == PEX_TypeRef) {
    if (bVar6) {
      target = (PType *)callop->Function[1].super_ZCC_TreeNode.SiblingNext;
      uVar1 = PType::FindConversion
                        (*(PType **)(*(long *)&(pZVar4->super_ZCC_Expression).Operation + 0x28),
                         target,local_78,8);
      if ((int)uVar1 < 0) {
        Error(this,(ZCC_TreeNode *)callop,"Cannot convert type 1 to type 2");
        (callop->super_ZCC_Expression).Type = &TypeError->super_PType;
        *(undefined8 *)&(callop->super_ZCC_Expression).super_ZCC_TreeNode.NodeType = 0x14;
      }
      else {
        pZVar4 = *(ZCC_ExprConstant **)&(pZVar4->super_ZCC_Expression).Operation;
        if (uVar1 != 0) {
          uVar5 = 0;
          do {
            if ((pZVar4->super_ZCC_Expression).Operation == PEX_ConstValue) {
              (*local_78[uVar5]->ConvertConstant)(pZVar4,&this->AST->Strings);
            }
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        if ((pZVar4->super_ZCC_Expression).Type != target) {
          __assert_fail("val->Type == dest",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                        ,0x18c,
                        "ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)");
        }
      }
      if (-1 < (int)uVar1) {
        return &pZVar4->super_ZCC_Expression;
      }
    }
    else {
      Error(this,(ZCC_TreeNode *)callop,"Type cast requires one parameter");
      (callop->super_ZCC_Expression).Type = &TypeError->super_PType;
      *(undefined8 *)&(callop->super_ZCC_Expression).super_ZCC_TreeNode.NodeType = 0x14;
    }
  }
  return &callop->super_ZCC_Expression;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *callop)
{
	ZCC_FuncParm *parm;
	int parmcount = 0;

	callop->Function = Simplify(callop->Function);
	parm = callop->Parameters;
	if (parm != NULL)
	{
		do
		{
			parmcount++;
			assert(parm->NodeType == AST_FuncParm);
			parm->Value = Simplify(parm->Value);
			parm = static_cast<ZCC_FuncParm *>(parm->SiblingNext);
		}
		while (parm != callop->Parameters);
	}
	// If the left side is a type ref, then this is actually a cast
	// and not a function call.
	if (callop->Function->Operation == PEX_TypeRef)
	{
		if (parmcount != 1)
		{
			Error(callop, "Type cast requires one parameter");
			callop->ToErrorNode();
		}
		else
		{
			PType *dest = static_cast<ZCC_ExprTypeRef *>(callop->Function)->RefType;
			const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
			int routelen = parm->Value->Type->FindConversion(dest, route, countof(route));
			if (routelen < 0)
			{
				///FIXME: Need real type names
				Error(callop, "Cannot convert type 1 to type 2");
				callop->ToErrorNode();
			}
			else
			{
				ZCC_Expression *val = ApplyConversion(parm->Value, route, routelen);
				assert(val->Type == dest);
				return val;
			}
		}
	}
	return callop;
}